

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O2

int __thiscall
ICM::DefFunc::Comp::NumComp::sign
          (NumComp *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  InitList local_60;
  TypeObject local_50;
  TypeObject local_38;
  DefaultType local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_60._M_array = &local_38;
  local_38.type = T_Number;
  local_38.sign = (Signature *)0x0;
  local_38.functableunit = (FuncTableUnit *)0x0;
  local_18 = 0;
  uStack_10 = 0;
  local_60._M_len = 2;
  local_50.type = T_Boolean;
  local_50.sign = (Signature *)0x0;
  local_50.functableunit = (FuncTableUnit *)0x0;
  local_20 = local_38.type;
  Function::Signature::Signature((Signature *)this,&local_60,&local_50,false);
  return (int)this;
}

Assistant:

S sign() const {
					return S({ T_Number, T_Number }, T_Boolean); // (N N) -> Bool
				}